

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O1

int32_t __thiscall icu_63::CollationElementIterator::getOffset(CollationElementIterator *this)

{
  UVector32 *pUVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  
  if (((this->dir_ < '\0') && (pUVar1 = this->offsets_, pUVar1 != (UVector32 *)0x0)) &&
     (iVar2 = pUVar1->count, iVar2 != 0)) {
    uVar4 = (uint)(this->otherHalf_ != 0) + (this->iter_->ceBuffer).length;
    iVar3 = 0;
    if (((-1 < (int)uVar4) && (iVar3 = 0, 0 < iVar2)) && ((int)uVar4 < iVar2)) {
      iVar3 = pUVar1->elements[uVar4];
    }
    return iVar3;
  }
  iVar2 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
  return iVar2;
}

Assistant:

int32_t CollationElementIterator::getOffset() const
{
    if (dir_ < 0 && offsets_ != NULL && !offsets_->isEmpty()) {
        // CollationIterator::previousCE() decrements the CEs length
        // while it pops CEs from its internal buffer.
        int32_t i = iter_->getCEsLength();
        if (otherHalf_ != 0) {
            // Return the trailing CE offset while we are in the middle of a 64-bit CE.
            ++i;
        }
        U_ASSERT(i < offsets_->size());
        return offsets_->elementAti(i);
    }
    return iter_->getOffset();
}